

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  Table **ppTVar2;
  u8 uVar3;
  Parse *pParse;
  Select *pSVar4;
  SrcList *pSVar5;
  IdList *pIVar6;
  Upsert *pUVar7;
  sqlite3 *psVar8;
  Db *pDVar9;
  Window *pWVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  FuncDef *pFVar15;
  NameContext *pNC;
  ExprList *pEVar16;
  Expr *pEVar17;
  Window *pWVar18;
  byte bVar19;
  ushort uVar20;
  long lVar21;
  long lVar22;
  Expr *pFrom;
  char *pcVar23;
  char *pcVar24;
  uint uVar25;
  Table *pTVar26;
  Schema *pSVar27;
  Table **ppTVar28;
  NameContext *pNVar29;
  ulong uVar30;
  char **ppcVar31;
  char *zLeft;
  Column *pCVar32;
  ulong uVar33;
  Window **ppWVar34;
  uint uVar35;
  char *pcVar36;
  Table **ppTVar37;
  uint uVar38;
  Schema *pSVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  u8 local_109;
  char *local_f8;
  SrcList_item *local_e8;
  SrcList_item *local_c8;
  NameContext *local_c0;
  int *local_b0;
  int local_a8;
  sqlite3 *local_a0;
  SrcList *local_70;
  undefined8 local_68;
  Walker w;
  
  pNC = (pWalker->u).pNC;
  pParse = pNC->pParse;
  uVar3 = pExpr->op;
  iVar14 = 2;
  switch(uVar3) {
  case '-':
    goto switchD_00164951_caseD_2d;
  case '.':
  case '/':
  case '2':
  case '3':
  case ':':
    goto switchD_00164951_caseD_2e;
  case '0':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    goto switchD_00164951_caseD_30;
  case '1':
    break;
  case ';':
    local_f8 = (pExpr->u).zToken;
    local_a0 = pParse->db;
    pExpr->iTable = -1;
    pcVar23 = (char *)0x0;
    pSVar39 = (Schema *)0x0;
    pcVar24 = (char *)0x0;
LAB_00164ba3:
    local_b0 = &pExpr->iTable;
    ppTVar37 = &pParse->pTriggerTab;
    local_109 = 0x9e;
    local_e8 = (SrcList_item *)0x0;
    local_a8 = 0;
    iVar14 = 0;
    local_c0 = pNC;
    do {
      pSVar5 = local_c0->pSrcList;
      if (pSVar5 == (SrcList *)0x0) {
        iVar13 = 0;
      }
      else {
        local_c8 = pSVar5->a;
        iVar13 = 0;
        for (iVar11 = 0; iVar11 < pSVar5->nSrc; iVar11 = iVar11 + 1) {
          pTVar26 = local_c8->pTab;
          pSVar4 = local_c8->pSelect;
          if ((pSVar4 == (Select *)0x0) || ((pSVar4->selFlags & 0x800) == 0)) {
LAB_00164cea:
            if ((pcVar24 == (char *)0x0) || (pTVar26->pSchema == pSVar39)) {
              if (pcVar23 != (char *)0x0) {
                pcVar36 = local_c8->zAlias;
                zLeft = pcVar36;
                if (pcVar36 == (char *)0x0) {
                  zLeft = pTVar26->zName;
                }
                iVar12 = sqlite3StrICmp(zLeft,pcVar23);
                if (iVar12 != 0) goto LAB_00164e6f;
                if ((pcVar36 != (char *)0x0) && (1 < pParse->eParseMode)) {
                  sqlite3RenameTokenRemap(pParse,(void *)0x0,&pExpr->y);
                }
              }
              if (iVar14 == 0) {
                local_e8 = local_c8;
              }
              iVar14 = iVar14 + 1;
              pCVar32 = pTVar26->aCol;
              uVar35 = (uint)(ushort)pTVar26->nCol;
              uVar25 = 0;
              if (pTVar26->nCol < 1) {
                uVar35 = 0;
              }
              for (; uVar25 != uVar35; uVar25 = uVar25 + 1) {
                iVar12 = sqlite3StrICmp(pCVar32->zName,local_f8);
                if (iVar12 == 0) {
                  if (iVar13 != 1) {
LAB_00164e29:
                    iVar13 = iVar13 + 1;
                    if (uVar25 == (int)pTVar26->iPKey) {
                      uVar25 = 0xffff;
                    }
                    pExpr->iColumn = (ynVar)uVar25;
                    local_e8 = local_c8;
                    break;
                  }
                  if (((local_c8->fg).jointype & 4) == 0) {
                    pIVar6 = local_c8->pUsing;
                    if (pIVar6 == (IdList *)0x0) goto LAB_00164e29;
                    uVar38 = pIVar6->nId;
                    if (pIVar6->nId < 1) {
                      uVar38 = 0;
                    }
                    lVar22 = 0;
                    do {
                      if ((ulong)uVar38 * 0x10 + 0x10 == lVar22 + 0x10) goto LAB_00164e29;
                      iVar12 = sqlite3StrICmp(*(char **)((long)&pIVar6->a->zName + lVar22),local_f8)
                      ;
                      lVar22 = lVar22 + 0x10;
                    } while (iVar12 != 0);
                  }
                }
                pCVar32 = pCVar32 + 1;
              }
            }
          }
          else {
            uVar25 = pSVar4->pEList->nExpr;
            uVar30 = 0;
            uVar33 = (ulong)uVar25;
            if ((int)uVar25 < 1) {
              uVar33 = uVar30;
            }
            ppcVar31 = &pSVar4->pEList->a[0].zSpan;
            bVar43 = false;
            for (; uVar33 != uVar30; uVar30 = uVar30 + 1) {
              iVar12 = sqlite3MatchSpanName(*ppcVar31,local_f8,pcVar23,pcVar24);
              if (iVar12 != 0) {
                iVar13 = iVar13 + 1;
                pExpr->iColumn = (ynVar)uVar30;
                local_e8 = local_c8;
                bVar43 = true;
                iVar14 = 2;
              }
              ppcVar31 = ppcVar31 + 4;
            }
            if (!bVar43 && pcVar23 != (char *)0x0) goto LAB_00164cea;
          }
LAB_00164e6f:
          local_c8 = local_c8 + 1;
        }
        if (local_e8 == (SrcList_item *)0x0) {
          local_e8 = (SrcList_item *)0x0;
        }
        else {
          *local_b0 = local_e8->iCursor;
          pTVar26 = local_e8->pTab;
          (pExpr->y).pTab = pTVar26;
          if (((local_e8->fg).jointype & 8) != 0) {
            pbVar1 = (byte *)((long)&pExpr->flags + 2);
            *pbVar1 = *pbVar1 | 0x10;
          }
          pSVar39 = pTVar26->pSchema;
        }
      }
      if (iVar14 == 0 && (pcVar23 != (char *)0x0 && pcVar24 == (char *)0x0)) {
        pTVar26 = *ppTVar37;
        if (pTVar26 == (Table *)0x0) {
          pTVar26 = (Table *)0x0;
        }
        else {
          uVar3 = pParse->eTriggerOp;
          if (uVar3 == 'u') {
LAB_00164f28:
            iVar11 = sqlite3StrICmp("old",pcVar23);
            iVar14 = 0;
            if (iVar11 == 0) {
LAB_00164f45:
              *local_b0 = iVar14;
              goto LAB_00164f4f;
            }
          }
          else {
            iVar11 = sqlite3StrICmp("new",pcVar23);
            iVar14 = 1;
            if (iVar11 == 0) goto LAB_00164f45;
            if (uVar3 != 't') goto LAB_00164f28;
          }
          pTVar26 = (Table *)0x0;
        }
LAB_00164f4f:
        if ((((local_c0->ncFlags & 0x200) != 0) &&
            (pUVar7 = (local_c0->uNC).pUpsert, pUVar7 != (Upsert *)0x0)) &&
           (iVar14 = sqlite3StrICmp("excluded",pcVar23), iVar14 == 0)) {
          pTVar26 = pUVar7->pUpsertSrc->a[0].pTab;
          *local_b0 = 2;
        }
        if (pTVar26 == (Table *)0x0) {
          iVar14 = 0;
        }
        else {
          pCVar32 = pTVar26->aCol;
          pSVar39 = pTVar26->pSchema;
          uVar38 = (uint)pTVar26->nCol;
          uVar25 = 0;
          uVar35 = 0;
          if (0 < pTVar26->nCol) {
            uVar25 = 0;
            uVar35 = uVar38;
          }
          for (; uVar35 != uVar25; uVar25 = uVar25 + 1) {
            iVar14 = sqlite3StrICmp(pCVar32->zName,local_f8);
            if (iVar14 == 0) {
              if ((int)pTVar26->iPKey == uVar25) {
                uVar25 = 0xffffffff;
              }
              uVar35 = uVar25;
              if ((int)uVar25 < (int)uVar38) goto LAB_00165022;
              break;
            }
            pCVar32 = pCVar32 + 1;
          }
          iVar14 = sqlite3IsRowid(local_f8);
          if (iVar14 != 0) {
            uVar35 = uVar35 | -(uint)((pTVar26->tabFlags & 0x40) == 0);
          }
LAB_00165022:
          if ((int)uVar35 < (int)uVar38) {
            iVar13 = iVar13 + 1;
            if (*local_b0 == 2) {
              if (pParse->eParseMode < 2) {
                pExpr->iTable = uVar35 + ((local_c0->uNC).pUpsert)->regData;
                pbVar1 = (byte *)((long)&pExpr->flags + 2);
                *pbVar1 = *pbVar1 | 0x40;
                local_109 = 0xa4;
              }
              else {
                pExpr->iColumn = (ynVar)uVar35;
                (pExpr->y).pTab = pTVar26;
                local_109 = 0x9e;
              }
            }
            else {
              if ((int)uVar35 < 0) {
                pExpr->affinity = 'D';
              }
              else {
                uVar25 = 1 << ((byte)uVar35 & 0x1f);
                if (0x1f < uVar35) {
                  uVar25 = 0xffffffff;
                }
                if (*local_b0 == 0) {
                  pParse->oldmask = pParse->oldmask | uVar25;
                }
                else {
                  pParse->newmask = pParse->newmask | uVar25;
                }
              }
              (pExpr->y).pTab = pTVar26;
              pExpr->iColumn = (ynVar)uVar35;
              local_109 = 'M';
            }
          }
          iVar14 = 1;
        }
      }
      uVar20 = local_c0->ncFlags;
      if ((((iVar13 == 0) && (iVar14 == 1)) &&
          ((local_e8 != (SrcList_item *)0x0 &&
           ((iVar13 = 0, (uVar20 & 0x20) == 0 && (iVar11 = sqlite3IsRowid(local_f8), iVar11 != 0))))
          )) && ((local_e8->pTab->tabFlags & 0x40) == 0)) {
        pExpr->iColumn = -1;
        pExpr->affinity = 'D';
        iVar13 = 1;
      }
      if (((pcVar23 == (char *)0x0) && ((uVar20 & 0x80) != 0)) && (iVar13 == 0)) {
        pEVar16 = (local_c0->uNC).pEList;
        uVar25 = pEVar16->nExpr;
        if (pEVar16->nExpr < 1) {
          uVar25 = 0;
        }
        ppcVar31 = &pEVar16->a[0].zName;
        for (uVar33 = 0; uVar25 != uVar33; uVar33 = uVar33 + 1) {
          pcVar36 = *ppcVar31;
          if ((pcVar36 != (char *)0x0) && (iVar13 = sqlite3StrICmp(pcVar36,local_f8), iVar13 == 0))
          {
            if (((uVar20 & 1) == 0) && ((((ExprList_item *)(ppcVar31 + -1))->pExpr->flags & 2) != 0)
               ) {
              sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar36);
              return 2;
            }
            iVar14 = sqlite3ExprVectorSize(((ExprList_item *)(ppcVar31 + -1))->pExpr);
            if (iVar14 != 1) {
              sqlite3ErrorMsg(pParse,"row value misused");
              return 2;
            }
            resolveAlias(pParse,pEVar16,(int)uVar33,pExpr,"",local_a8);
            if (1 < pParse->eParseMode) {
              sqlite3RenameTokenRemap(pParse,(void *)0x0,pExpr);
            }
            goto LAB_001656b0;
          }
          ppcVar31 = ppcVar31 + 4;
        }
      }
      else if (iVar13 != 0) {
        if (iVar13 == 1) {
          bVar43 = true;
          goto LAB_00165639;
        }
        pcVar36 = "ambiguous column name";
        goto LAB_001654c7;
      }
      local_c0 = local_c0->pNext;
      local_a8 = local_a8 + 1;
    } while (local_c0 != (NameContext *)0x0);
    pcVar36 = "no such column";
    if (pcVar23 == (char *)0x0) {
      if ((pExpr->flags & 0x40) != 0) {
        pExpr->op = 'j';
        (pExpr->y).pTab = (Table *)0x0;
        return 1;
      }
      iVar14 = sqlite3ExprIdToTrueFalse(pExpr);
      if (iVar14 != 0) {
        return 1;
      }
      local_c0 = (NameContext *)0x0;
    }
    else {
      local_c0 = (NameContext *)0x0;
    }
LAB_001654c7:
    if (pcVar24 == (char *)0x0) {
      if (pcVar23 == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar36,local_f8);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar36,pcVar23,local_f8);
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar36,pcVar24,pcVar23,local_f8);
    }
    pParse->checkSchema = '\x01';
    pNC->nErr = pNC->nErr + 1;
    bVar43 = false;
LAB_00165639:
    uVar20 = pExpr->iColumn;
    if ((-1 < (short)uVar20) && (local_e8 != (SrcList_item *)0x0)) {
      bVar19 = 0x3f;
      if (uVar20 < 0x3f) {
        bVar19 = (byte)uVar20;
      }
      local_e8->colUsed = local_e8->colUsed | 1L << (bVar19 & 0x3f);
    }
    sqlite3ExprDelete(local_a0,pExpr->pLeft);
    pExpr->pLeft = (Expr *)0x0;
    sqlite3ExprDelete(local_a0,pExpr->pRight);
    pExpr->pRight = (Expr *)0x0;
    pExpr->op = local_109;
    pbVar1 = (byte *)((long)&pExpr->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
    if (!bVar43) {
      return 2;
    }
LAB_001656b0:
    if (((pExpr->flags & 0x400000) == 0) && (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
      pSVar5 = local_c0->pSrcList;
      iVar14 = sqlite3SchemaToIndex(pParse->db,pSVar39);
      if (-1 < iVar14) {
        if (pExpr->op != 'M') {
          uVar25 = pSVar5->nSrc;
          uVar33 = 0;
          if (0 < (int)uVar25) {
            uVar33 = (ulong)uVar25;
          }
          lVar22 = uVar33 + 1;
          ppTVar28 = (Table **)&pSVar5[-1].a[0].pSelect;
          do {
            lVar22 = lVar22 + -1;
            if (lVar22 == 0) goto LAB_00165772;
            ppTVar37 = ppTVar28 + 0xe;
            ppTVar2 = ppTVar28 + 0x12;
            ppTVar28 = ppTVar37;
          } while (*local_b0 != *(int *)ppTVar2);
        }
        pTVar26 = *ppTVar37;
        if (pTVar26 != (Table *)0x0) {
          lVar22 = (long)pExpr->iColumn;
          if ((pExpr->iColumn < 0) && (lVar22 = (long)pTVar26->iPKey, lVar22 < 0)) {
            pcVar24 = "ROWID";
          }
          else {
            pcVar24 = pTVar26->aCol[lVar22].zName;
          }
          iVar14 = sqlite3AuthReadCol(pParse,(char *)pTVar26->zName,pcVar24,iVar14);
          if (iVar14 == 2) {
            pExpr->op = 'n';
          }
        }
      }
    }
LAB_00165772:
    for (; pNC->nRef = pNC->nRef + 1, pNC != local_c0; pNC = pNC->pNext) {
    }
    return 1;
  default:
    if ((uVar3 != '\x14') && (uVar3 != '\x7f')) {
      if (uVar3 == 0x82) {
        pEVar17 = pExpr->pLeft;
        notValid(pParse,pNC,"the \".\" operator",0x20);
        pFrom = pExpr->pRight;
        if (pFrom->op == ';') {
          pcVar24 = (char *)0x0;
        }
        else {
          pcVar24 = (pEVar17->u).zToken;
          pEVar17 = pFrom->pLeft;
          pFrom = pFrom->pRight;
        }
        pcVar23 = (pEVar17->u).zToken;
        local_f8 = (pFrom->u).zToken;
        if (1 < pParse->eParseMode) {
          sqlite3RenameTokenRemap(pParse,pExpr,pFrom);
          sqlite3RenameTokenRemap(pParse,&pExpr->y,pEVar17);
        }
        local_a0 = pParse->db;
        pExpr->iTable = -1;
        pSVar39 = (Schema *)0x0;
        if ((pcVar24 == (char *)0x0) || ((pNC->ncFlags & 6) != 0)) {
          pcVar24 = (char *)0x0;
        }
        else {
          pSVar27 = (Schema *)(ulong)(uint)local_a0->nDb;
          if (local_a0->nDb < 1) {
            pSVar27 = pSVar39;
          }
          lVar22 = 0;
          do {
            lVar21 = lVar22;
            if ((long)pSVar27 * 0x20 + 0x20 == lVar21 + 0x20) {
              pSVar39 = (Schema *)0x0;
              goto LAB_00164ba3;
            }
            pDVar9 = local_a0->aDb;
            iVar14 = sqlite3StrICmp(*(char **)((long)&pDVar9->zDbSName + lVar21),pcVar24);
            lVar22 = lVar21 + 0x20;
          } while (iVar14 != 0);
          pSVar39 = *(Schema **)((long)&pDVar9->pSchema + lVar21);
        }
        goto LAB_00164ba3;
      }
      if (uVar3 == 0x90) {
        notValid(pParse,pNC,"parameters",0x26);
        goto switchD_00164951_caseD_2e;
      }
      if (uVar3 == 0x9c) goto switchD_00164951_caseD_2d;
      if (uVar3 != 0x9d) goto switchD_00164951_caseD_2e;
      pSVar4 = (pExpr->x).pSelect;
      if (pSVar4 == (Select *)0x0) {
        iVar14 = 0;
      }
      else {
        iVar14 = *(int *)&pSVar4->pEList;
      }
      psVar8 = pParse->db;
      uVar3 = psVar8->enc;
      pcVar24 = (pExpr->u).zToken;
      iVar13 = sqlite3Strlen30(pcVar24);
      pFVar15 = sqlite3FindFunction(psVar8,pcVar24,iVar14,uVar3,'\0');
      if (pFVar15 == (FuncDef *)0x0) {
        bVar40 = false;
        pFVar15 = sqlite3FindFunction(pParse->db,pcVar24,-2,uVar3,'\0');
        bVar41 = pFVar15 == (FuncDef *)0x0;
        bVar43 = !bVar41;
      }
      else {
        bVar40 = pFVar15->xFinalize != (_func_void_sqlite3_context_ptr *)0x0;
        if ((pFVar15->funcFlags & 0x400) != 0) {
          pExpr->flags = pExpr->flags | 0x41000;
          if (iVar14 == 2) {
            w.pParse = (Parse *)0xbff0000000000000;
            if ((char)pSVar4->pSrc->nSrc == -0x73) {
              pSVar39 = pSVar4->pSrc->a[0].pSchema;
              iVar14 = sqlite3Strlen30((char *)pSVar39);
              sqlite3AtoF((char *)pSVar39,(double *)&w,iVar14,'\x01');
              if (1.0 < (double)w.pParse) goto LAB_00165343;
              pExpr->iTable = (int)((double)w.pParse * 134217728.0);
              if (-1 < (int)((double)w.pParse * 134217728.0)) goto LAB_0016541b;
            }
            else {
LAB_00165343:
              pExpr->iTable = -1;
            }
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNC->nErr = pNC->nErr + 1;
          }
          else {
            iVar14 = 0x7800000;
            if (*pFVar15->zName == 'u') {
              iVar14 = 0x800000;
            }
            pExpr->iTable = iVar14;
          }
        }
LAB_0016541b:
        iVar14 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFVar15->zName,(char *)0x0);
        if (iVar14 != 0) {
          if (iVar14 == 1) {
            sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFVar15->zName);
            pNC->nErr = pNC->nErr + 1;
          }
          pExpr->op = 'n';
          return 1;
        }
        uVar25 = pFVar15->funcFlags;
        if ((uVar25 & 0x2800) != 0) {
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 8;
        }
        if ((uVar25 >> 0xb & 1) == 0) {
          notValid(pParse,pNC,"non-deterministic functions",0x22);
          uVar25 = pFVar15->funcFlags;
        }
        bVar41 = true;
        if ((uVar25 >> 0x12 & 1) == 0) {
          bVar43 = true;
        }
        else {
          bVar42 = pParse->nested != '\0';
          bVar43 = sqlite3Config.bInternalFunctions != 0 || bVar42;
          if (sqlite3Config.bInternalFunctions == 0 && !bVar42) {
            pFVar15 = (FuncDef *)0x0;
          }
        }
      }
      bVar42 = bVar40;
      if (pParse->eParseMode < 2) {
        if (((pFVar15 == (FuncDef *)0x0) ||
            (pFVar15->xValue != (_func_void_sqlite3_context_ptr *)0x0)) ||
           ((pExpr->flags & 0x1000000) == 0)) {
          if (bVar40) {
            if ((pNC->ncFlags & 1) != 0) {
              if ((pFVar15->funcFlags >> 0x10 & 1) == 0) {
                bVar42 = (pExpr->y).pTab != (Table *)0x0;
              }
              else {
                bVar42 = true;
                if ((pExpr->y).pTab == (Table *)0x0) goto LAB_001657b7;
              }
              if (!bVar42 || ((byte)(pNC->ncFlags >> 0xe) & 1) != 0) goto LAB_001657e2;
            }
LAB_001657b7:
            if ((pFVar15->funcFlags >> 0x10 & 1) == 0) {
              pcVar23 = "window";
              if ((pExpr->y).pTab == (Table *)0x0) {
                pcVar23 = "aggregate";
              }
            }
            else {
              pcVar23 = "window";
            }
            bVar42 = false;
            sqlite3ErrorMsg(pParse,"misuse of %s function %.*s()",pcVar23,iVar13,pcVar24);
            pNC->nErr = pNC->nErr + 1;
            goto LAB_00165889;
          }
LAB_001657e2:
          pcVar23 = "wrong number of arguments to function %.*s()";
          if (!bVar43) {
            bVar43 = (pParse->db->init).busy != '\0';
            if (!bVar43) {
              pcVar23 = "no such function: %.*s";
            }
            bVar41 = (bool)(bVar43 & bVar41);
          }
          if (!bVar41) goto LAB_00165813;
        }
        else {
          pcVar23 = "%.*s() may not be used as a window function";
LAB_00165813:
          sqlite3ErrorMsg(pParse,pcVar23,iVar13,pcVar24);
          pNC->nErr = pNC->nErr + 1;
        }
        bVar42 = false;
        if (bVar40) {
          uVar20 = 0xbfff;
          if ((pExpr->y).pTab == (Table *)0x0) {
            uVar20 = 0xfffe;
          }
          pNC->ncFlags = pNC->ncFlags & uVar20;
          bVar42 = true;
        }
      }
LAB_00165889:
      sqlite3WalkExprList(pWalker,(ExprList *)pSVar4);
      if (!bVar42) {
        return 1;
      }
      if ((pExpr->y).pWin == (Window *)0x0) {
        pExpr->op = 0x9f;
        pExpr->op2 = '\0';
        pNVar29 = pNC;
        do {
          if (pNVar29 == (NameContext *)0x0) {
LAB_001659d2:
            *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 1;
            return 1;
          }
          local_70 = pNVar29->pSrcList;
          w.xExprCallback = exprSrcCount;
          w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
          local_68 = 0;
          w.u.pNC = (NameContext *)&local_70;
          sqlite3WalkExprList(&w,(pExpr->x).pList);
          if ((0 < (int)local_68) || (local_68._4_4_ == 0)) {
            pNVar29->ncFlags = (ushort)pFVar15->funcFlags & 0x1000 | pNVar29->ncFlags | 0x10;
            goto LAB_001659d2;
          }
          pExpr->op2 = pExpr->op2 + '\x01';
          pNVar29 = pNVar29->pNext;
        } while( true );
      }
      pSVar4 = pNC->pWinSelect;
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pPartition);
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pOrderBy);
      sqlite3WalkExpr(pWalker,((pExpr->y).pWin)->pFilter);
      pWVar18 = (pExpr->y).pWin;
      pcVar24 = pWVar18->zName;
      if ((pcVar24 == (char *)0x0) || (pWVar18->eType != '\0')) {
LAB_00165a65:
        if ((pFVar15->funcFlags & 0x10000) != 0) {
          if (pWVar18->pFilter == (Expr *)0x0) {
            psVar8 = pParse->db;
            pcVar24 = pFVar15->zName;
            if (pcVar24 == "row_number" || pcVar24 == "ntile") {
              sqlite3ExprDelete(psVar8,pWVar18->pStart);
              sqlite3ExprDelete(psVar8,pWVar18->pEnd);
              pWVar18->pStart = (Expr *)0x0;
              pWVar18->pEnd = (Expr *)0x0;
              pWVar18->eType = 'L';
              pWVar18->eStart = 'W';
            }
            else {
              if ((((pcVar24 != "cume_dist") && (pcVar24 != "percent_rank")) &&
                  (pcVar24 != "dense_rank")) && (pcVar24 != "rank")) goto LAB_00165b4a;
              sqlite3ExprDelete(psVar8,pWVar18->pStart);
              sqlite3ExprDelete(psVar8,pWVar18->pEnd);
              pWVar18->pStart = (Expr *)0x0;
              pWVar18->pEnd = (Expr *)0x0;
              pWVar18->eType = 'V';
              pWVar18->eStart = 'W';
            }
            pWVar18->eEnd = 'R';
          }
          else {
            sqlite3ErrorMsg(pParse,"FILTER clause may only be used with aggregate window functions")
            ;
          }
        }
LAB_00165b4a:
        pWVar18->pFunc = pFVar15;
      }
      else {
        ppWVar34 = &pSVar4->pWinDefn;
        while (pWVar10 = *ppWVar34, pWVar10 != (Window *)0x0) {
          iVar14 = sqlite3StrICmp(pWVar10->zName,pcVar24);
          if (iVar14 == 0) {
            pEVar16 = sqlite3ExprListDup(pParse->db,pWVar10->pPartition,0);
            pWVar18->pPartition = pEVar16;
            pEVar16 = sqlite3ExprListDup(pParse->db,pWVar10->pOrderBy,0);
            pWVar18->pOrderBy = pEVar16;
            pEVar17 = sqlite3ExprDup(pParse->db,pWVar10->pStart,0);
            pWVar18->pStart = pEVar17;
            pEVar17 = sqlite3ExprDup(pParse->db,pWVar10->pEnd,0);
            pWVar18->pEnd = pEVar17;
            pWVar18->eStart = pWVar10->eStart;
            pWVar18->eEnd = pWVar10->eEnd;
            pWVar18->eType = pWVar10->eType;
            goto LAB_00165a65;
          }
          ppWVar34 = &pWVar10->pNextWin;
        }
        sqlite3ErrorMsg(pParse,"no such window: %s",pcVar24);
      }
      if (pSVar4->pWin == (Window *)0x0) {
        pWVar18 = (Window *)0x0;
      }
      else {
        iVar14 = sqlite3WindowCompare(pParse,pSVar4->pWin,(pExpr->y).pWin);
        if (iVar14 != 0) goto LAB_00165b8b;
        pWVar18 = pSVar4->pWin;
      }
      ((pExpr->y).pTab)->pCheck = (ExprList *)pWVar18;
      pSVar4->pWin = (Window *)pExpr->y;
LAB_00165b8b:
      pbVar1 = (byte *)((long)&pNC->ncFlags + 1);
      *pbVar1 = *pbVar1 | 0x40;
      return 1;
    }
  }
  if ((pExpr->flags & 0x800) != 0) {
    iVar13 = pNC->nRef;
    notValid(pParse,pNC,"subqueries",0x26);
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar13 != pNC->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
      *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 0x40;
    }
  }
  goto switchD_00164951_caseD_2e;
switchD_00164951_caseD_2d:
  pEVar17 = pExpr->pRight;
  if (pEVar17->op == ';') {
    iVar13 = resolveExprStep(pWalker,pEVar17);
    if (iVar13 == 2) {
      return 2;
    }
    if (pEVar17->op == 0x9b) {
      pExpr->op2 = pExpr->op;
      pExpr->op = 0xa3;
      return 0;
    }
  }
switchD_00164951_caseD_30:
  if (pParse->db->mallocFailed != '\0') goto switchD_00164951_caseD_2e;
  iVar13 = sqlite3ExprVectorSize(pExpr->pLeft);
  if (pExpr->op == '0') {
    pEVar16 = (pExpr->x).pList;
    iVar11 = sqlite3ExprVectorSize(pEVar16->a[0].pExpr);
    if (iVar11 == iVar13) {
      pEVar16 = pEVar16 + 1;
      goto LAB_00164a7d;
    }
  }
  else {
    pEVar16 = (ExprList *)&pExpr->pRight;
LAB_00164a7d:
    iVar11 = sqlite3ExprVectorSize(*(Expr **)pEVar16);
  }
  if (iVar13 != iVar11) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
switchD_00164951_caseD_2e:
  if (pParse->nErr == 0) {
    iVar14 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar14;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a;
      assert( HasRowid(pItem->pTab) && pItem->pTab->pSelect==0 );
      pExpr->op = TK_COLUMN;
      pExpr->y.pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        Expr *pLeft = pExpr->pLeft;
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pLeft->u.zToken;
          pLeft = pRight->pLeft;
          pRight = pRight->pRight;
        }
        zTable = pLeft->u.zToken;
        zColumn = pRight->u.zToken;
        if( IN_RENAME_OBJECT ){
          sqlite3RenameTokenRemap(pParse, (void*)pExpr, (void*)pRight);
          sqlite3RenameTokenRemap(pParse, (void*)&pExpr->y.pTab, (void*)pLeft);
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_INTERNAL)!=0
         && pParse->nested==0
         && sqlite3Config.bInternalFunctions==0
        ){
          /* Internal-use-only functions are disallowed unless the
          ** SQL is being compiled using sqlite3NestedParse() */
          no_such_func = 1;
          pDef = 0;
        }
      }

      if( 0==IN_RENAME_OBJECT ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        assert( is_agg==0 || (pDef->funcFlags & SQLITE_FUNC_MINMAX)
          || (pDef->xValue==0 && pDef->xInverse==0)
          || (pDef->xValue && pDef->xInverse && pDef->xSFunc && pDef->xFinalize)
        );
        if( pDef && pDef->xValue==0 && ExprHasProperty(pExpr, EP_WinFunc) ){
          sqlite3ErrorMsg(pParse, 
              "%.*s() may not be used as a window function", nId, zId
          );
          pNC->nErr++;
        }else if( 
              (is_agg && (pNC->ncFlags & NC_AllowAgg)==0)
           || (is_agg && (pDef->funcFlags&SQLITE_FUNC_WINDOW) && !pExpr->y.pWin)
           || (is_agg && pExpr->y.pWin && (pNC->ncFlags & NC_AllowWin)==0)
        ){
          const char *zType;
          if( (pDef->funcFlags & SQLITE_FUNC_WINDOW) || pExpr->y.pWin ){
            zType = "window";
          }else{
            zType = "aggregate";
          }
          sqlite3ErrorMsg(pParse, "misuse of %s function %.*s()",zType,nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#else
        if( (is_agg && (pNC->ncFlags & NC_AllowAgg)==0) ){
          sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#endif
        else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                  && pParse->explain==0
#endif
        ){
          sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
          pNC->nErr++;
        }else if( wrong_num_args ){
          sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
               nId, zId);
          pNC->nErr++;
        }
        if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
          pNC->ncFlags &= ~(pExpr->y.pWin ? NC_AllowWin : NC_AllowAgg);
#else
          pNC->ncFlags &= ~NC_AllowAgg;
#endif
        }
      }
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( pExpr->y.pWin ){
          Select *pSel = pNC->pWinSelect;
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pPartition);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pOrderBy);
          sqlite3WalkExpr(pWalker, pExpr->y.pWin->pFilter);
          sqlite3WindowUpdate(pParse, pSel->pWinDefn, pExpr->y.pWin, pDef);
          if( 0==pSel->pWin 
           || 0==sqlite3WindowCompare(pParse, pSel->pWin, pExpr->y.pWin) 
          ){
            pExpr->y.pWin->pNextWin = pSel->pWin;
            pSel->pWin = pExpr->y.pWin;
          }
          pNC->ncFlags |= NC_AllowWin;
        }else
#endif /* SQLITE_OMIT_WINDOWFUNC */
        {
          NameContext *pNC2 = pNC;
          pExpr->op = TK_AGG_FUNCTION;
          pExpr->op2 = 0;
          while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
            pExpr->op2++;
            pNC2 = pNC2->pNext;
          }
          assert( pDef!=0 );
          if( pNC2 ){
            assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
            testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
            pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

          }
          pNC->ncFlags |= NC_AllowAgg;
        }
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      Expr *pRight;
      assert( !ExprHasProperty(pExpr, EP_Reduced) );
      /* Handle special cases of "x IS TRUE", "x IS FALSE", "x IS NOT TRUE",
      ** and "x IS NOT FALSE". */
      if( (pRight = pExpr->pRight)->op==TK_ID ){
        int rc = resolveExprStep(pWalker, pRight);
        if( rc==WRC_Abort ) return WRC_Abort;
        if( pRight->op==TK_TRUEFALSE ){
          pExpr->op2 = pExpr->op;
          pExpr->op = TK_TRUTH;
          return WRC_Continue;
        }
      }
      /* Fall thru */
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}